

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOHasPath(FmsIOContext *ctx,char *path)

{
  int iVar1;
  long __off;
  char *pcVar2;
  char *in_RSI;
  undefined8 *in_RDI;
  char *ptr;
  int found;
  long cur_loc;
  char k [512];
  int err;
  int local_234;
  char local_228 [524];
  int local_1c;
  char *local_18;
  undefined8 *local_10;
  int local_4;
  
  local_1c = 0;
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 1;
  }
  else if (in_RSI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    __off = ftell((FILE *)*in_RDI);
    if (__off < 0) {
      local_4 = 3;
    }
    else {
      local_1c = FmsIOReadKeyValue((FmsIOContext *)k._440_8_,(char *)k._432_8_,(char *)k._424_8_);
      fseek((FILE *)*local_10,__off,0);
      if (local_1c == 2) {
        local_4 = 0;
      }
      else if (local_1c == 0) {
        local_234 = 0;
        while (iVar1 = strcmp(local_228,local_18), iVar1 != 0) {
          pcVar2 = strrchr(local_228,0x2f);
          if (pcVar2 == (char *)0x0) goto LAB_0011b48a;
          *pcVar2 = '\0';
        }
        local_234 = 1;
LAB_0011b48a:
        local_4 = local_234;
      }
      else {
        local_4 = 4;
      }
    }
  }
  return local_4;
}

Assistant:

static int
FmsIOHasPath(FmsIOContext *ctx, const char *path) {
  int err = 0;
  char k[FMS_BUFFER_SIZE];
  if(!ctx) E_RETURN(1);
  if(!path) E_RETURN(2);

  long cur_loc = ftell(ctx->fp);
  if(cur_loc < 0)
    E_RETURN(3);
  err = FmsIOReadKeyValue(ctx, k, NULL);
  fseek(ctx->fp, cur_loc, SEEK_SET);
  // EoF, not an error in this context - just means return false.
  if(err == 2)
    return 0;
  else if(err)
    E_RETURN(4);

  // Need to find each / from the right and compare each time to match conduit functionality
  int found = 0;
  while(1) {
    if(strcmp(k, path) == 0) {
      found = 1;
      break;
    }
    char *ptr = strrchr(k, '/');
    if(ptr == NULL)
      break;
    *ptr = '\0';
  }
  return found;

}